

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

char * bstr_make_cstr(uint8_t *pBegin,uint8_t *pEnd)

{
  uint uVar1;
  uint8_t *str;
  uint32_t len;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  if (((pBegin == (uint8_t *)0x0) || (pEnd == (uint8_t *)0x0)) || (pEnd <= pBegin)) {
    pBegin_local = (uint8_t *)0x0;
  }
  else {
    uVar1 = (int)pEnd - (int)pBegin;
    pBegin_local = (uint8_t *)malloc((ulong)(uVar1 + 1));
    if (pBegin_local != (uint8_t *)0x0) {
      memcpy(pBegin_local,pBegin,(ulong)uVar1);
      pBegin_local[uVar1] = '\0';
    }
  }
  return (char *)pBegin_local;
}

Assistant:

char* bstr_make_cstr(const uint8_t *pBegin, const uint8_t *pEnd){
   if( (pBegin != 0) && (pEnd != 0) && (pBegin<pEnd)){
      uint32_t len = (uint32_t) (pEnd-pBegin);
      uint8_t *str = (uint8_t*) malloc(len+1);
      if(str != 0){
         memcpy(str,pBegin,len);
         str[len]=0;
      }
      return (char*) str;
   }
   return 0;
}